

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O2

void GD::vec_add_multipredict<dense_parameters>
               (multipredict_info<dense_parameters> *mp,float fx,uint64_t fi)

{
  ulong uVar1;
  polyprediction *ppVar2;
  size_t c;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (1e-10 <= ABS(fx)) {
    uVar1 = mp->weights->_weight_mask;
    sVar5 = mp->count;
    ppVar2 = mp->pred;
    uVar4 = fi & uVar1;
    uVar3 = (sVar5 - 1) * mp->step + uVar4;
    if (uVar1 < uVar3) {
      for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
        ppVar2->scalar =
             mp->weights->_begin[mp->weights->_weight_mask & uVar4 & uVar1] * fx + ppVar2->scalar;
        uVar4 = (uVar4 & uVar1) + mp->step;
        ppVar2 = ppVar2 + 1;
        sVar5 = mp->count;
      }
    }
    else {
      for (; uVar4 <= uVar3; uVar4 = uVar4 + mp->step) {
        ppVar2->scalar =
             mp->weights->_begin[mp->weights->_weight_mask & uVar4] * fx + ppVar2->scalar;
        ppVar2 = ppVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

inline void vec_add_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  if ((-1e-10 < fx) && (fx < 1e-10))
    return;
  uint64_t mask = mp.weights.mask();
  polyprediction* p = mp.pred;
  fi &= mask;
  uint64_t top = fi + (uint64_t)((mp.count - 1) * mp.step);
  uint64_t i = 0;
  if (top <= mask)
  {
    i += fi;
    for (; i <= top; i += mp.step, ++p)
      p->scalar +=
          fx * mp.weights[i];  // TODO: figure out how to use weight_parameters::iterator (not using change_begin())
  }
  else  // TODO: this could be faster by unrolling into two loops
    for (size_t c = 0; c < mp.count; ++c, fi += (uint64_t)mp.step, ++p)
    {
      fi &= mask;
      p->scalar += fx * mp.weights[fi];
    }
}